

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void ftxui::anon_unknown_0::UpdatePixelStyle
               (Screen *screen,stringstream *ss,Pixel *prev,Pixel *next)

{
  pointer pbVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (next->hyperlink != prev->hyperlink) {
    poVar4 = std::operator<<((ostream *)(ss + 0x10),"\x1b]8;;");
    pbVar1 = (screen->hyperlinks_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    if ((ulong)next->hyperlink <
        (ulong)((long)(screen->hyperlinks_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
      uVar7 = (uint)next->hyperlink;
    }
    poVar4 = std::operator<<(poVar4,(string *)
                                    ((long)&(pbVar1->_M_dataplus)._M_p + (ulong)(uVar7 << 5)));
    std::operator<<(poVar4,"\x1b\\");
  }
  bVar2 = *(byte *)next;
  bVar5 = *(byte *)prev;
  bVar6 = bVar5 ^ bVar2;
  if ((bVar6 >> 2 & 1) != 0 || (bVar5 & 2) != (bVar2 & 2)) {
    poVar4 = (ostream *)(ss + 0x10);
    if ((bVar2 & 2) == 0 && (bVar5 & 2) != 0) {
      pcVar9 = "\x1b[22m";
    }
    else {
      pcVar9 = "";
      if (((bVar5 & 4) != 0) && (pcVar9 = "", (bVar2 & 4) == 0)) {
        pcVar9 = "\x1b[22m";
      }
    }
    std::operator<<(poVar4,pcVar9);
    pcVar9 = "\x1b[1m";
    if ((undefined1  [48])((undefined1  [48])*next & (undefined1  [48])0x2) == (undefined1  [48])0x0
       ) {
      pcVar9 = "";
    }
    std::operator<<(poVar4,pcVar9);
    pcVar9 = "\x1b[2m";
    if ((undefined1  [48])((undefined1  [48])*next & (undefined1  [48])0x4) == (undefined1  [48])0x0
       ) {
      pcVar9 = "";
    }
    std::operator<<(poVar4,pcVar9);
    bVar2 = *(byte *)next;
    bVar5 = *(byte *)prev;
    bVar6 = bVar5 ^ bVar2;
  }
  if ((bVar6 & 0x30) != 0) {
    pcVar9 = "\x1b[21m";
    if ((bVar2 & 0x20) == 0) {
      pcVar9 = "\x1b[24m";
    }
    pcVar8 = "\x1b[4m";
    if ((bVar2 & 0x10) == 0) {
      pcVar8 = pcVar9;
    }
    std::operator<<((ostream *)(ss + 0x10),pcVar8);
    bVar2 = *(byte *)next;
    bVar5 = *(byte *)prev;
    bVar6 = bVar5 ^ bVar2;
  }
  if ((bVar6 & 1) != 0) {
    pcVar9 = "\x1b[25m";
    if ((bVar2 & 1) != 0) {
      pcVar9 = "\x1b[5m";
    }
    std::operator<<((ostream *)(ss + 0x10),pcVar9);
    bVar2 = *(byte *)next;
    bVar5 = *(byte *)prev;
  }
  if ((bool)((bVar2 & 8) >> 3) != ((bVar5 >> 3 & 1) != 0)) {
    pcVar9 = "\x1b[7m";
    if ((bVar2 & 8) == 0) {
      pcVar9 = "\x1b[27m";
    }
    std::operator<<((ostream *)(ss + 0x10),pcVar9);
    bVar2 = *(byte *)next;
    bVar5 = *(byte *)prev;
  }
  if ((bool)((bVar2 & 0x40) >> 6) != ((bVar5 >> 6 & 1) != 0)) {
    pcVar9 = "\x1b[9m";
    if ((bVar2 & 0x40) == 0) {
      pcVar9 = "\x1b[29m";
    }
    std::operator<<((ostream *)(ss + 0x10),pcVar9);
  }
  bVar3 = Color::operator!=(&next->foreground_color,&prev->foreground_color);
  if ((bVar3) || (bVar3 = Color::operator!=(&next->background_color,&prev->background_color), bVar3)
     ) {
    Color::Print_abi_cxx11_(&local_48,&next->foreground_color,false);
    std::operator+(&bStack_88,"\x1b[",&local_48);
    std::operator+(&local_68,&bStack_88,"m");
    std::operator<<((ostream *)(ss + 0x10),(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_48);
    Color::Print_abi_cxx11_(&local_48,&next->background_color,true);
    std::operator+(&bStack_88,"\x1b[",&local_48);
    std::operator+(&local_68,&bStack_88,"m");
    std::operator<<((ostream *)(ss + 0x10),(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void UpdatePixelStyle(const Screen* screen,
                      std::stringstream& ss,
                      const Pixel& prev,
                      const Pixel& next) {
  // See https://gist.github.com/egmontkob/eb114294efbcd5adb1944c9f3cb5feda
  if (FTXUI_UNLIKELY(next.hyperlink != prev.hyperlink)) {
    ss << "\x1B]8;;" << screen->Hyperlink(next.hyperlink) << "\x1B\\";
  }

  // Bold
  if (FTXUI_UNLIKELY((next.bold ^ prev.bold) | (next.dim ^ prev.dim))) {
    // BOLD_AND_DIM_RESET:
    ss << ((prev.bold && !next.bold) || (prev.dim && !next.dim) ? "\x1B[22m"
                                                                : "");
    ss << (next.bold ? "\x1B[1m" : "");  // BOLD_SET
    ss << (next.dim ? "\x1B[2m" : "");   // DIM_SET
  }

  // Underline
  if (FTXUI_UNLIKELY(next.underlined != prev.underlined ||
                     next.underlined_double != prev.underlined_double)) {
    ss << (next.underlined          ? "\x1B[4m"     // UNDERLINE
           : next.underlined_double ? "\x1B[21m"    // UNDERLINE_DOUBLE
                                    : "\x1B[24m");  // UNDERLINE_RESET
  }

  // Blink
  if (FTXUI_UNLIKELY(next.blink != prev.blink)) {
    ss << (next.blink ? "\x1B[5m"     // BLINK_SET
                      : "\x1B[25m");  // BLINK_RESET
  }

  // Inverted
  if (FTXUI_UNLIKELY(next.inverted != prev.inverted)) {
    ss << (next.inverted ? "\x1B[7m"     // INVERTED_SET
                         : "\x1B[27m");  // INVERTED_RESET
  }

  // StrikeThrough
  if (FTXUI_UNLIKELY(next.strikethrough != prev.strikethrough)) {
    ss << (next.strikethrough ? "\x1B[9m"     // CROSSED_OUT
                              : "\x1B[29m");  // CROSSED_OUT_RESET
  }

  if (FTXUI_UNLIKELY(next.foreground_color != prev.foreground_color ||
                     next.background_color != prev.background_color)) {
    ss << "\x1B[" + next.foreground_color.Print(false) + "m";
    ss << "\x1B[" + next.background_color.Print(true) + "m";
  }
}